

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

Vector<unsigned_int,_4>
gl4cts::Math::greaterThan<4>(Vector<double,_4> *left,Vector<double,_4> *right)

{
  undefined1 auVar1 [13];
  undefined1 auVar2 [13];
  undefined1 auVar3 [13];
  ulong uVar4;
  undefined1 auVar5 [13];
  Vector<unsigned_int,_4> *result;
  long lVar6;
  undefined1 (*in_RDI) [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  Vector<unsigned_int,_4> VVar9;
  Vector<bool,_4> res;
  
  res.m_data[0] = false;
  res.m_data[1] = false;
  res.m_data[2] = false;
  res.m_data[3] = false;
  lVar6 = 0;
  do {
    auVar8._8_8_ = -(ulong)((right->m_data + lVar6)[1] < (left->m_data + lVar6)[1]);
    auVar8._0_8_ = -(ulong)(right->m_data[lVar6] < left->m_data[lVar6]);
    auVar8 = packssdw(auVar8,auVar8);
    auVar8 = packssdw(auVar8,auVar8);
    auVar8 = packsswb(auVar8,auVar8);
    *(ushort *)(res.m_data + lVar6) = auVar8._0_2_ & 0x101;
    lVar6 = lVar6 + 2;
  } while (lVar6 != 4);
  *in_RDI = (undefined1  [16])0x0;
  uVar4 = (ulong)res.m_data._0_2_ & 0xffffffffffff00ff;
  auVar1._8_4_ = 0;
  auVar1._0_8_ = uVar4;
  auVar1[0xc] = res.m_data[3];
  auVar2[8] = res.m_data[2];
  auVar2._0_8_ = uVar4;
  auVar2[9] = 0;
  auVar2._10_3_ = auVar1._10_3_;
  auVar5._5_8_ = 0;
  auVar5._0_5_ = auVar2._8_5_;
  auVar7._0_4_ = (undefined4)uVar4;
  auVar3[4] = res.m_data[1];
  auVar3._0_4_ = auVar7._0_4_;
  auVar3[5] = 0;
  auVar3._6_7_ = SUB137(auVar5 << 0x40,6);
  auVar7._4_9_ = auVar3._4_9_;
  auVar7._13_3_ = 0;
  *in_RDI = auVar7;
  VVar9.m_data._8_8_ = right;
  VVar9.m_data._0_8_ = in_RDI;
  return (Vector<unsigned_int,_4>)VVar9.m_data;
}

Assistant:

static tcu::Vector<glw::GLuint, Size> greaterThan(const tcu::Vector<glw::GLdouble, Size>& left,
												  const tcu::Vector<glw::GLdouble, Size>& right)
{
	return convertBvecToUvec(tcu::greaterThan(left, right));
}